

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall Condition::Action(Condition *this)

{
  int line_number;
  int character_number;
  pointer pSVar1;
  LogTools *this_00;
  compile_errcode cVar2;
  allocator aStack_76;
  allocator aStack_75;
  SymbolType expression_type;
  string sStack_70;
  string local_50;
  
  while( true ) {
    SymbolQueue::GetCurrentName(handle_correct_queue);
    pSVar1 = (handle_correct_queue->m_symbol_queue).
             super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
             _M_start;
    line_number = pSVar1[handle_correct_queue->m_current_locate].m_line_number;
    character_number = pSVar1[handle_correct_queue->m_current_locate].m_character_number;
    cVar2 = Expression::Action(&this->m_expression,&expression_type);
    this_00 = g_log_tools;
    if (cVar2 != 0) break;
    if (expression_type == CHAR) {
      std::__cxx11::string::string((string *)&sStack_70,"condition must be int",&aStack_75);
      std::__cxx11::string::string((string *)&local_50,"",&aStack_76);
      LogTools::SemanticErrorLogs(this_00,&sStack_70,&local_50,line_number,character_number);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&sStack_70);
    }
    Expression::LogOutput(&this->m_expression);
  }
  return -1;
}

Assistant:

compile_errcode Condition::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    if (expression_type == CHAR) {
                        g_log_tools->SemanticErrorLogs("condition must be int", string(""), line_number, character_number);
                    }
                    m_expression.LogOutput();
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (IsRelationalOpeartor(name)) {
                    state = 2;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    if (expression_type == CHAR) {
                        g_log_tools->SemanticErrorLogs("condition must be int", string(""), line_number, character_number);
                    }
                    m_expression.LogOutput();
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: return COMPILE_OK;
        }
        if (state == 2)
            handle_correct_queue->NextSymbol();
    }
}